

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall
pbrt::ParameterDictionary::ParameterDictionary
          (ParameterDictionary *this,ParsedParameterVector *p0,ParsedParameterVector *params1,
          RGBColorSpace *colorSpace)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  reverse_iterator<pbrt::ParsedParameter_*const_*> local_30;
  reverse_iterator<pbrt::ParsedParameter_*const_*> local_28;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&this->params,p0);
  this->colorSpace = colorSpace;
  paVar2 = &(this->params).field_2;
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  if (paVar1 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar1 = paVar2;
  }
  std::__reverse<pbrt::ParsedParameter**>(paVar1,(long)paVar1 + (this->params).nStored * 8);
  if (colorSpace != (RGBColorSpace *)0x0) {
    paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(this->params).ptr;
    if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar2 = paVar1;
    }
    local_30.current = (ParsedParameter **)&params1->field_2;
    if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
         *)params1->ptr !=
        (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
         *)0x0) {
      local_30.current = params1->ptr;
    }
    local_28.current = local_30.current + params1->nStored * 8;
    InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
    ::insert<std::reverse_iterator<pbrt::ParsedParameter*const*>>
              ((InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
                *)this,paVar2->fixed + (this->params).nStored,&local_28,&local_30);
    checkParameterTypes(this);
    return;
  }
  LogFatal<char_const(&)[22]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
             ,0xaa,"Check failed: %s",(char (*) [22])0x582106);
}

Assistant:

ParameterDictionary::ParameterDictionary(ParsedParameterVector p0,
                                         const ParsedParameterVector &params1,
                                         const RGBColorSpace *colorSpace)
    : params(std::move(p0)), colorSpace(colorSpace) {
    std::reverse(params.begin(), params.end());
    CHECK(colorSpace != nullptr);
    params.insert(params.end(), params1.rbegin(), params1.rend());
    checkParameterTypes();
}